

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

basic_substring<char> __thiscall
c4::basic_substring<char>::trimr(basic_substring<char> *this,char c)

{
  basic_substring<char> bVar1;
  error_flags eVar2;
  size_t sVar3;
  basic_substring<char> *pbVar4;
  long *in_RDI;
  bool bVar5;
  size_t pos;
  size_t rnum_1;
  size_t rnum;
  size_t in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  undefined1 uVar6;
  basic_substring<char> *in_stack_fffffffffffffee0;
  basic_substring<char> *this_00;
  undefined5 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeed;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  char *local_d8;
  size_t local_d0;
  char *local_78;
  size_t local_70;
  char *local_18;
  size_t local_10;
  
  bVar5 = true;
  if (in_RDI[1] != 0) {
    bVar5 = *in_RDI == 0;
  }
  if ((bVar5) ||
     (sVar3 = last_not_of((basic_substring<char> *)
                          CONCAT17(in_stack_fffffffffffffeef,
                                   CONCAT16(in_stack_fffffffffffffeee,
                                            CONCAT15(in_stack_fffffffffffffeed,
                                                     in_stack_fffffffffffffee8))),
                          (char)((ulong)in_stack_fffffffffffffee0 >> 0x38),
                          CONCAT17(in_stack_fffffffffffffedf,
                                   CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8))),
     sVar3 == 0xffffffffffffffff)) {
    basic_substring(in_stack_fffffffffffffee0,
                    (char *)CONCAT17(in_stack_fffffffffffffedf,
                                     CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                    (size_t)in_RDI);
    local_d8 = local_78;
    local_d0 = local_70;
  }
  else {
    pbVar4 = (basic_substring<char> *)(sVar3 + 1);
    if ((basic_substring<char> *)in_RDI[1] < pbVar4 &&
        pbVar4 != (basic_substring<char> *)0xffffffffffffffff) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x153b,"check failed: %s",
                   "(num >= 0 && num <= len) || (num == npos)");
    }
    this_00 = pbVar4;
    if (pbVar4 == (basic_substring<char> *)0xffffffffffffffff) {
      this_00 = (basic_substring<char> *)in_RDI[1];
    }
    uVar6 = this_00 <= (basic_substring<char> *)in_RDI[1] || pbVar4 == (basic_substring<char> *)0x0;
    if (this_00 > (basic_substring<char> *)in_RDI[1] && pbVar4 != (basic_substring<char> *)0x0) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) &&
         (in_stack_fffffffffffffede = is_debugger_attached(), (bool)in_stack_fffffffffffffede)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x153d,"check failed: %s",
                   "(first >= 0 && first + rnum <= len) || (num == 0)");
    }
    basic_substring(this_00,(char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffede,
                                                            in_stack_fffffffffffffed8)),
                    in_stack_fffffffffffffed0);
    local_d8 = local_18;
    local_d0 = local_10;
  }
  bVar1.len = local_d0;
  bVar1.str = local_d8;
  return bVar1;
}

Assistant:

basic_substring trimr(const C c) const
    {
        if( ! empty())
        {
            size_t pos = last_not_of(c, npos);
            if(pos != npos)
                return sub(0, pos+1);
        }
        return sub(0, 0);
    }